

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

word Abc_Tt6IsopCover(word uOn,word uOnDc,int nVars,int *pCover,int *pnCubes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  word wVar5;
  word wVar6;
  word wVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uOnDc_00;
  ulong uVar12;
  ulong uVar13;
  ulong uOnDc_01;
  int nVars_00;
  long lVar14;
  
  if (6 < nVars) {
    __assert_fail("nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x986,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
  }
  if ((~uOnDc & uOn) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x987,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
  }
  if (uOn == 0) {
    wVar7 = 0;
  }
  else if (uOnDc == 0xffffffffffffffff) {
    iVar9 = *pnCubes;
    *pnCubes = iVar9 + 1;
    pCover[iVar9] = 0;
    wVar7 = 0xffffffffffffffff;
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x98f,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
    }
    iVar9 = nVars * 2;
    uVar4 = (ulong)(uint)nVars;
    do {
      uVar11 = uVar4;
      iVar9 = iVar9 + -2;
      if ((long)uVar11 < 1) {
        __assert_fail("Var >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x994,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
      }
      bVar8 = (byte)(1 << ((char)uVar11 - 1U & 0x1f));
    } while (((*(ulong *)(&DAT_00a3a538 + uVar11 * 8) & (uOn >> (bVar8 & 0x3f) ^ uOn)) == 0) &&
            (uVar4 = uVar11 - 1,
            (*(ulong *)(&DAT_00a3a538 + uVar11 * 8) & (uOnDc >> (bVar8 & 0x3f) ^ uOnDc)) == 0));
    nVars_00 = (int)(uVar11 - 1);
    uVar11 = uVar11 - 1 & 0xffffffff;
    uVar4 = s_Truths6Neg[uVar11];
    uVar12 = (uVar4 & uOn) << (bVar8 & 0x3f) | uVar4 & uOn;
    uVar11 = s_Truths6[uVar11];
    uVar13 = (uVar11 & uOn) >> (bVar8 & 0x3f) | uVar11 & uOn;
    uOnDc_01 = (uVar4 & uOnDc) << (bVar8 & 0x3f) | uVar4 & uOnDc;
    uOnDc_00 = (uOnDc & uVar11) >> (bVar8 & 0x3f) | uOnDc & uVar11;
    iVar1 = *pnCubes;
    lVar14 = (long)iVar1;
    wVar5 = Abc_Tt6IsopCover(~uOnDc_00 & uVar12,uOnDc_01,nVars_00,pCover,pnCubes);
    iVar2 = *pnCubes;
    lVar10 = (long)iVar2;
    wVar6 = Abc_Tt6IsopCover(~uOnDc_01 & uVar13,uOnDc_00,nVars_00,pCover,pnCubes);
    iVar3 = *pnCubes;
    wVar7 = Abc_Tt6IsopCover(~wVar6 & uVar13 | ~wVar5 & uVar12,uOnDc_00 & uOnDc_01,nVars_00,pCover,
                             pnCubes);
    if (iVar1 < iVar2) {
      do {
        pCover[lVar14] = pCover[lVar14] | 1 << ((byte)iVar9 & 0x1f);
        lVar14 = lVar14 + 1;
      } while (lVar10 != lVar14);
    }
    wVar7 = wVar6 & uVar11 | wVar5 & uVar4 | wVar7;
    if (iVar2 < iVar3) {
      do {
        pCover[lVar10] = pCover[lVar10] | 2 << ((byte)iVar9 & 0x1f);
        lVar10 = lVar10 + 1;
      } while (iVar3 != lVar10);
    }
    if ((~wVar7 & uOn) != 0) {
      __assert_fail("(uOn & ~uRes2) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x9a7,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
    }
    if ((~uOnDc & wVar7) != 0) {
      __assert_fail("(uRes2 & ~uOnDc) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x9a8,"word Abc_Tt6IsopCover(word, word, int, int *, int *)");
    }
  }
  return wVar7;
}

Assistant:

static inline word Abc_Tt6IsopCover( word uOn, word uOnDc, int nVars, int * pCover, int * pnCubes )
{
    word uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    int c, Var, nBeg0, nEnd0, nEnd1;
    assert( nVars <= 6 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
        return 0;
    if ( uOnDc == ~(word)0 )
    {
        pCover[(*pnCubes)++] = 0;
        return ~(word)0;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( uOn, Var ) || Abc_Tt6HasVar( uOnDc, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = Abc_Tt6Cofactor0( uOn,   Var );
    uOn1   = Abc_Tt6Cofactor1( uOn  , Var );
    uOnDc0 = Abc_Tt6Cofactor0( uOnDc, Var );
    uOnDc1 = Abc_Tt6Cofactor1( uOnDc, Var );
    // solve for cofactors
    nBeg0 = *pnCubes; 
    uRes0 = Abc_Tt6IsopCover( uOn0 & ~uOnDc1, uOnDc0, Var, pCover, pnCubes );
    nEnd0 = *pnCubes;
    uRes1 = Abc_Tt6IsopCover( uOn1 & ~uOnDc0, uOnDc1, Var, pCover, pnCubes );
    nEnd1 = *pnCubes;
    uRes2 = Abc_Tt6IsopCover( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, Var, pCover, pnCubes );
    // derive the final truth table
    uRes2 |= (uRes0 & s_Truths6Neg[Var]) | (uRes1 & s_Truths6[Var]);
    for ( c = nBeg0; c < nEnd0; c++ )
        pCover[c] |= (1 << (2*Var+0));
    for ( c = nEnd0; c < nEnd1; c++ )
        pCover[c] |= (1 << (2*Var+1));
    assert( (uOn & ~uRes2) == 0 );
    assert( (uRes2 & ~uOnDc) == 0 );
    return uRes2;
}